

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall yy::parser::yy_lac_establish_(parser *this,symbol_kind_type yytoken)

{
  bool bVar1;
  ostream *poVar2;
  char *yystr;
  char local_41;
  string local_40;
  
  bVar1 = true;
  if (this->yy_lac_established_ == false) {
    if (this->yydebug_ != 0) {
      poVar2 = this->yycdebug_;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"LAC: initial context established for ",0x25);
      yytnamerr__abi_cxx11_(&local_40,*(parser **)(yytname_ + (long)yytoken * 8),yystr);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
      local_41 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    this->yy_lac_established_ = true;
    bVar1 = yy_lac_check_(this,yytoken);
  }
  return bVar1;
}

Assistant:

bool
  parser::yy_lac_establish_ (symbol_kind_type yytoken)
  {
    /* Establish the initial context for the current lookahead if no initial
       context is currently established.

       We define a context as a snapshot of the parser stacks.  We define
       the initial context for a lookahead as the context in which the
       parser initially examines that lookahead in order to select a
       syntactic action.  Thus, if the lookahead eventually proves
       syntactically unacceptable (possibly in a later context reached via a
       series of reductions), the initial context can be used to determine
       the exact set of tokens that would be syntactically acceptable in the
       lookahead's place.  Moreover, it is the context after which any
       further semantic actions would be erroneous because they would be
       determined by a syntactically unacceptable token.

       yy_lac_establish_ should be invoked when a reduction is about to be
       performed in an inconsistent state (which, for the purposes of LAC,
       includes consistent states that don't know they're consistent because
       their default reductions have been disabled).

       For parse.lac=full, the implementation of yy_lac_establish_ is as
       follows.  If no initial context is currently established for the
       current lookahead, then check if that lookahead can eventually be
       shifted if syntactic actions continue from the current context.  */
    if (yy_lac_established_)
      return true;
    else
      {
#if YYDEBUG
        YYCDEBUG << "LAC: initial context established for "
                 << symbol_name (yytoken) << '\n';
#endif
        yy_lac_established_ = true;
        return yy_lac_check_ (yytoken);
      }
  }